

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O1

QString * QSysInfo::kernelVersion(void)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  storage_type *in_RCX;
  char *pcVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView ba;
  utsname u;
  utsname local_19e;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_19e,0xaa,0x186);
  iVar1 = uname(&local_19e);
  if (iVar1 == 0) {
    __s = local_19e.release;
    pcVar2 = (char *)memchr(__s,0,0x41);
    pcVar3 = local_19e.version;
    if (pcVar2 != (char *)0x0) {
      pcVar3 = pcVar2;
    }
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)__s;
    QString::fromLatin1(in_RDI,(QString *)(pcVar3 + -(long)__s),ba);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_002186b5;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_002186b5:
      __stack_chk_fail();
    }
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (char16_t *)0x0;
    (in_RDI->d).size = 0;
  }
  return in_RDI;
}

Assistant:

QString QSysInfo::kernelVersion()
{
#ifdef Q_OS_WIN
    const auto osver = QOperatingSystemVersion::current();
    return QString::asprintf("%d.%d.%d",
                             osver.majorVersion(), osver.minorVersion(), osver.microVersion());
#else
    struct utsname u;
    if (uname(&u) == 0) {
#   ifdef Q_OS_VXWORKS
        // The string follows the pattern "Core Kernel version: w.x.y.z"
        auto versionStr = QByteArrayView(u.kernelversion);
        if (auto lastSpace = versionStr.lastIndexOf(' '); lastSpace != -1) {
            return QString::fromLatin1(versionStr.sliced(lastSpace + 1));
        }
#   else
        return QString::fromLatin1(u.release);
#   endif
    }
    return QString();
#endif
}